

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O3

void test_errors_in_serve(void)

{
  cio_error cVar1;
  cio_inet_address *arg1;
  long lVar2;
  cio_http_server_configuration config;
  cio_http_server server;
  cio_http_server_configuration cStack_238;
  cio_http_server local_180;
  
  lVar2 = 8;
  do {
    cio_server_socket_set_reuse_address_fake.return_val = *(cio_error *)(&UNK_00111118 + lVar2);
    cio_server_socket_bind_fake.return_val = *(cio_error *)(&UNK_0011111c + lVar2);
    cio_server_socket_accept_fake.return_val =
         *(cio_error *)((long)&test_errors_in_serve::serve_tests[0].reuse_addres_retval + lVar2);
    cio_server_socket_accept_fake.custom_fake =
         (_func_cio_error_cio_server_socket_ptr_cio_accept_handler_t_void_ptr *)0x0;
    memcpy(&cStack_238,&DAT_001189e0,0xb8);
    arg1 = cio_get_inet_address_any4();
    cio_init_inet_socket_address(&cStack_238.endpoint,arg1,0x1f90);
    cVar1 = cio_http_server_init(&local_180,&loop,&cStack_238);
    UnityAssertEqualNumber
              (0,(long)cVar1,"Server initialization failed!",0x644,UNITY_DISPLAY_STYLE_INT);
    cVar1 = cio_http_server_serve(&local_180);
    if (cVar1 == CIO_SUCCESS) {
      UnityFail("Serving http did not fail!",0x647);
    }
    UnityAssertEqualNumber
              (1,(ulong)cio_server_socket_close_fake.call_count,"Close was not called!",0x648,
               UNITY_DISPLAY_STYLE_INT);
    free(&client_socket[-2].impl.close_timer.impl.ev.fd);
    setUp();
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x2c);
  free(&client_socket[-2].impl.close_timer.impl.ev.fd);
  return;
}

Assistant:

static void test_errors_in_serve(void)
{
	struct serve_test {
		enum cio_error reuse_addres_retval;
		enum cio_error bind_retval;
		enum cio_error accept_retval;
	};

	static const struct serve_test serve_tests[] = {
	    {.reuse_addres_retval = CIO_INVALID_ARGUMENT, .bind_retval = CIO_SUCCESS, .accept_retval = CIO_SUCCESS},
	    {.reuse_addres_retval = CIO_SUCCESS, .bind_retval = CIO_INVALID_ARGUMENT, .accept_retval = CIO_SUCCESS},
	    {.reuse_addres_retval = CIO_SUCCESS, .bind_retval = CIO_SUCCESS, .accept_retval = CIO_INVALID_ARGUMENT},
	};

	for (unsigned int i = 0; i < ARRAY_SIZE(serve_tests); i++) {
		struct serve_test serve_test = serve_tests[i];

		cio_server_socket_set_reuse_address_fake.return_val = serve_test.reuse_addres_retval;
		cio_server_socket_bind_fake.return_val = serve_test.bind_retval;
		cio_server_socket_accept_fake.custom_fake = NULL;
		cio_server_socket_accept_fake.return_val = serve_test.accept_retval;

		struct cio_http_server_configuration config = {
		    .on_error = serve_error,
		    .read_header_timeout_ns = header_read_timeout,
		    .read_body_timeout_ns = body_read_timeout,
		    .response_timeout_ns = response_timeout,
		    .close_timeout_ns = 10,
		    .alloc_client = alloc_dummy_client,
		    .free_client = free_dummy_client};

		cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);

		struct cio_http_server server;
		enum cio_error err = cio_http_server_init(&server, &loop, &config);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Server initialization failed!");

		err = cio_http_server_serve(&server);
		TEST_ASSERT_NOT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Serving http did not fail!");
		TEST_ASSERT_EQUAL_MESSAGE(1, cio_server_socket_close_fake.call_count, "Close was not called!");

		free_dummy_client(client_socket);
		setUp();
	}

	free_dummy_client(client_socket);
}